

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minReLeave(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,int leave,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,bool polish)

{
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar1;
  type_conflict5 tVar2;
  Status SVar3;
  undefined8 uVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *to;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  pointer pnVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<50U,_int,_void> local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  if (leave < 0) goto LAB_00277df3;
  pSVar5 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pUVar1 = pSVar5->theFvec;
  tVar2 = boost::multiprecision::operator>
                    ((pSVar5->theUBbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (uint)leave,
                     (pSVar5->theLBbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (uint)leave);
  if (tVar2) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[](&local_160,&pUVar1->thedelta,leave);
    local_198.fpclass = cpp_dec_float_finite;
    local_198.prec_elem = 10;
    local_198.data._M_elems[0] = 0;
    local_198.data._M_elems[1] = 0;
    local_198.data._M_elems[2] = 0;
    local_198.data._M_elems[3] = 0;
    local_198.data._M_elems[4] = 0;
    local_198.data._M_elems[5] = 0;
    local_198.data._M_elems._24_5_ = 0;
    local_198.data._M_elems[7]._1_3_ = 0;
    local_198.data._M_elems._32_5_ = 0;
    local_198._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_198,&(this->fastDelta).m_backend,&maxabs->m_backend);
    tVar2 = boost::multiprecision::operator>
                      (sel,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_198);
    if (!tVar2) goto LAB_00277df3;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)sel,0.0);
    if (polish) goto LAB_00277df3;
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    SVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dualStatus(&pSVar5->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ,(pSVar5->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).theBaseId.data + (uint)leave);
    if (SVar3 == D_ON_BOTH) goto LAB_00277df3;
    local_198.data._M_elems[0] = 0;
    local_198.data._M_elems[1] = 0;
    tVar2 = boost::multiprecision::operator>(&local_160,(double *)&local_198);
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar6 = (pUVar1->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start + (uint)leave;
    if (tVar2) {
      local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x20);
      local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6->m_backend;
      local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 8);
      local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x10);
      local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x18);
      local_68.m_backend.exp = *(int *)((long)&pnVar6->m_backend + 0x28);
      local_68.m_backend.neg = *(bool *)((long)&pnVar6->m_backend + 0x2c);
      local_68.m_backend._48_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x30);
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::shiftLBbound(pSVar5,leave,&local_68);
      goto LAB_00277df3;
    }
    local_a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x20);
    to = &local_a8;
    local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6->m_backend;
    local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 8);
    local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x10);
    local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x18);
    local_a8.m_backend.exp = *(int *)((long)&pnVar6->m_backend + 0x28);
    local_a8.m_backend.neg = *(bool *)((long)&pnVar6->m_backend + 0x2c);
    uVar4 = *(undefined8 *)((long)&pnVar6->m_backend + 0x30);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)sel,0.0);
    if (polish) goto LAB_00277df3;
    pnVar6 = (pUVar1->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x20);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[(uint)leave].m_backend;
    local_e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar6[(uint)leave].m_backend + 8);
    local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x10);
    local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x18);
    local_e8.m_backend.exp = *(int *)((long)(pnVar6 + (uint)leave) + 0x28);
    local_e8.m_backend.neg = *(bool *)((long)(pnVar6 + (uint)leave) + 0x2c);
    local_e8.m_backend._48_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x30);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shiftLBbound((this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver,leave,&local_e8);
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar6 = (pUVar1->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x20);
    to = &local_128;
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[(uint)leave].m_backend;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar6[(uint)leave].m_backend + 8);
    local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x10);
    local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x18);
    local_128.m_backend.exp = *(int *)((long)(pnVar6 + (uint)leave) + 0x28);
    local_128.m_backend.neg = *(bool *)((long)(pnVar6 + (uint)leave) + 0x2c);
    uVar4 = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x30);
  }
  (to->m_backend).fpclass = (int)uVar4;
  (to->m_backend).prec_elem = (int)((ulong)uVar4 >> 0x20);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::shiftUBbound(pSVar5,leave,to);
LAB_00277df3:
  return SUB41((uint)leave >> 0x1f,0);
}

Assistant:

bool SPxFastRT<R>::minReLeave(R& sel, int leave, R maxabs, bool polish)
{
   UpdateVector<R>& vec = this->thesolver->fVec();
   VectorBase<R>& low = this->thesolver->lbBound();
   VectorBase<R>& up = this->thesolver->ubBound();

   if(leave < 0)
      return true;

   if(up[leave] > low[leave])
   {
      R x = vec.delta()[leave];

      if(sel > fastDelta / maxabs)
      {
         sel = 0.0;

         if(!polish
               && this->thesolver->dualStatus(this->thesolver->baseId(leave)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
            // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         {
            if(x > 0.0)
               this->thesolver->shiftLBbound(leave, vec[leave]);
            else
               this->thesolver->shiftUBbound(leave, vec[leave]);
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         this->thesolver->shiftLBbound(leave, vec[leave]);
         this->thesolver->shiftUBbound(leave, vec[leave]);
      }
   }

   return false;
}